

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frm_driver.c
# Opt level: O2

int Display_Or_Erase_Field(FIELD *field,_Bool bEraseFlag)

{
  WINDOW_conflict *win;
  attr_t aVar1;
  WINDOW_conflict *pWVar2;
  chtype *pcVar3;
  
  if (field == (FIELD *)0x0) {
    return -1;
  }
  pWVar2 = field->form->sub;
  if ((pWVar2 == (WINDOW_conflict *)0x0) &&
     (pWVar2 = field->form->win, pWVar2 == (WINDOW_conflict *)0x0)) {
    pWVar2 = _stdscr;
  }
  win = (WINDOW_conflict *)
        derwin(pWVar2,(int)field->rows,(int)field->cols,(int)field->frow,(int)field->fcol);
  if (win == (WINDOW_conflict *)0x0) {
    return -1;
  }
  if ((field->opts & 1) == 0) {
    if (pWVar2 == (WINDOW_conflict *)0x0) {
      aVar1 = 0;
      goto LAB_0030245f;
    }
    pcVar3 = &pWVar2->_attrs;
  }
  else {
    wbkgdset(win,field->back | field->pad);
    pcVar3 = &field->fore;
  }
  aVar1 = *pcVar3;
LAB_0030245f:
  wattrset(win,aVar1);
  werase(win);
  if (!bEraseFlag) {
    if ((field->opts & 4U) != 0) {
      if ((((field->just == 0) || ((int)field->rows + field->nrow != 1)) ||
          (((uint)field->opts >> 9 & 1) == 0)) || (field->dcols != (int)field->cols)) {
        Buffer_To_Window(field,win);
      }
      else {
        Perform_Justification(field,win);
      }
    }
    *(byte *)&field->status = (byte)field->status & 0xfd;
  }
  wsyncup(win);
  delwin(win);
  return 0;
}

Assistant:

static int Display_Or_Erase_Field(FIELD * field, bool bEraseFlag)
{
  WINDOW *win;
  WINDOW *fwin;

  if (!field)
    return E_SYSTEM_ERROR;

  fwin = Get_Form_Window(field->form);
  win  = derwin(fwin,
                field->rows,field->cols,field->frow,field->fcol);

  if (!win) 
    return E_SYSTEM_ERROR;
  else
    {
      if (field->opts & O_VISIBLE)
        Set_Field_Window_Attributes(field,win);
      else
        {
#if defined(__LSB_VERSION__)
        /* getattrs() would be handy, but it is not part of LSB 4.0 */
        attr_t fwinAttrs;
        short  fwinPair;
        wattr_get(fwin, &fwinAttrs, &fwinPair, 0);
        wattr_set(win, fwinAttrs, fwinPair, 0);
#else
        wattrset(win,getattrs(fwin));
#endif
        }
      werase(win);
    }

  if (!bEraseFlag)
    {
      if (field->opts & O_PUBLIC)
        {
          if (Justification_Allowed(field))
            Perform_Justification(field,win);
          else
            Buffer_To_Window(field,win);
        }
      field->status &= ~_NEWTOP;
    }
  wsyncup(win);
  delwin(win);
  return E_OK;
}